

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O0

void __thiscall
efsw::FileWatcherInotify::removeWatchLocked(FileWatcherInotify *this,WatchID watchid)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  reference plVar4;
  int err;
  _Self local_b8;
  _Self local_b0;
  iterator eraseit;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_98;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_90;
  iterator eit;
  _Self local_78;
  undefined1 local_70 [8];
  vector<long,_std::allocator<long>_> eraseWatches;
  iterator it;
  const_iterator local_48;
  __normal_iterator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_40;
  __normal_iterator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_38;
  iterator itm;
  WatcherInotify *watch;
  _Self local_20;
  iterator iter;
  WatchID watchid_local;
  FileWatcherInotify *this_local;
  
  iter._M_node = (_Base_ptr)watchid;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
       ::find(&this->mWatches,(key_type *)&iter);
  watch = (WatcherInotify *)
          std::
          map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
          ::end(&this->mWatches);
  bVar1 = std::operator==(&local_20,(_Self *)&watch);
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator->
                       (&local_20);
    itm._M_current =
         (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)ppVar2->second;
    local_38._M_current =
         (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::begin(&this->mMovedOutsideWatches);
    while( true ) {
      local_40._M_current =
           (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&this->mMovedOutsideWatches);
      bVar1 = __gnu_cxx::operator!=(&local_40,&local_38);
      if (!bVar1) break;
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&local_38);
      if (ppVar3->first == (WatcherInotify *)itm._M_current) {
        __gnu_cxx::
        __normal_iterator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>const*,std::vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>>
        ::__normal_iterator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>*>
                  ((__normal_iterator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>const*,std::vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>>
                    *)&local_48,&local_38);
        std::
        vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::erase(&this->mMovedOutsideWatches,local_48);
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&local_38);
    }
    if (((itm._M_current[1].field_0x10 & 1) != 0) && (*(long *)&itm._M_current[2].field_0x10 == 0))
    {
      eraseWatches.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
                    ::begin(&this->mWatches);
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)local_70);
      while( true ) {
        local_78._M_node =
             (_Base_ptr)
             std::
             map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
             ::end(&this->mWatches);
        bVar1 = std::operator!=((_Self *)&eraseWatches.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage,&local_78);
        if (!bVar1) break;
        ppVar2 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_> *)
                            &eraseWatches.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        if (ppVar2->second != (WatcherInotify *)itm._M_current) {
          ppVar2 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::
                   operator->((_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_> *)
                              &eraseWatches.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
          bVar1 = WatcherInotify::inParentTree(ppVar2->second,(WatcherInotify *)itm._M_current);
          if (bVar1) {
            ppVar2 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::
                     operator->((_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_> *
                                )&eraseWatches.super__Vector_base<long,_std::allocator<long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<long,_std::allocator<long>_>::push_back
                      ((vector<long,_std::allocator<long>_> *)local_70,&ppVar2->second->InotifyID);
          }
        }
        std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_> *)
                   &eraseWatches.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      local_90._M_current =
           (long *)std::vector<long,_std::allocator<long>_>::begin
                             ((vector<long,_std::allocator<long>_> *)local_70);
      while( true ) {
        local_98._M_current =
             (long *)std::vector<long,_std::allocator<long>_>::end
                               ((vector<long,_std::allocator<long>_> *)local_70);
        bVar1 = __gnu_cxx::operator!=(&local_90,&local_98);
        if (!bVar1) break;
        plVar4 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator*(&local_90);
        (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[4])(this,*plVar4);
        __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                  (&local_90);
      }
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)local_70);
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::erase(&this->mWatchesRef,(key_type *)&(itm._M_current)->field_0x10);
    eraseit = std::
              map<long,efsw::WatcherInotify*,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
              ::erase_abi_cxx11_((map<long,efsw::WatcherInotify*,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
                                  *)&this->mWatches,local_20._M_node);
    if (*(long *)&itm._M_current[2].field_0x10 == 0) {
      local_b0._M_node =
           (_Base_ptr)
           std::
           map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
           ::find(&this->mRealWatches,(key_type *)&itm._M_current[2].field_0x18);
      local_b8._M_node =
           (_Base_ptr)
           std::
           map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
           ::end(&this->mRealWatches);
      bVar1 = std::operator!=(&local_b0,&local_b8);
      if (bVar1) {
        std::
        map<long,efsw::WatcherInotify*,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
        ::erase_abi_cxx11_((map<long,efsw::WatcherInotify*,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
                            *)&this->mRealWatches,(iterator)local_b0._M_node);
      }
    }
    inotify_rm_watch(this->mFD,(int)iter._M_node);
    if ((itm._M_current !=
         (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x0) &&
       (itm._M_current !=
        (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0)) {
      (*(code *)((itm._M_current)->first->super_Watcher).ID)();
    }
  }
  return;
}

Assistant:

void FileWatcherInotify::removeWatchLocked( WatchID watchid ) {
	WatchMap::iterator iter = mWatches.find( watchid );
	if ( iter == mWatches.end() )
		return;

	WatcherInotify* watch = iter->second;

	for ( std::vector<std::pair<WatcherInotify*, std::string>>::iterator itm =
			  mMovedOutsideWatches.begin();
		  mMovedOutsideWatches.end() != itm; ++itm ) {
		if ( itm->first == watch ) {
			mMovedOutsideWatches.erase( itm );
			break;
		}
	}

	if ( watch->Recursive && NULL == watch->Parent ) {
		WatchMap::iterator it = mWatches.begin();
		std::vector<WatchID> eraseWatches;

		for ( ; it != mWatches.end(); ++it )
			if ( it->second != watch && it->second->inParentTree( watch ) )
				eraseWatches.push_back( it->second->InotifyID );

		for ( std::vector<WatchID>::iterator eit = eraseWatches.begin(); eit != eraseWatches.end();
			  ++eit ) {
			removeWatch( *eit );
		}
	}

	mWatchesRef.erase( watch->Directory );
	mWatches.erase( iter );

	if ( NULL == watch->Parent ) {
		WatchMap::iterator eraseit = mRealWatches.find( watch->InotifyID );

		if ( eraseit != mRealWatches.end() ) {
			mRealWatches.erase( eraseit );
		}
	}

	int err = inotify_rm_watch( mFD, watchid );

	if ( err < 0 ) {
		efDEBUG( "Error removing watch %d: %s\n", watchid, strerror( errno ) );
	} else {
		efDEBUG( "Removed watch %s with id: %d\n", watch->Directory.c_str(), watchid );
	}

	efSAFE_DELETE( watch );
}